

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.hh
# Opt level: O0

string * __thiscall
tinyusdz::value::print_array_snipped<std::array<char,4ul>>
          (string *__return_storage_ptr__,value *this,array<char,_4UL> *vals,size_t n,size_t N)

{
  unsigned_long *puVar1;
  unsigned_long local_1e0;
  size_t i_2;
  size_t i_1;
  unsigned_long local_1c8;
  size_t tail_start;
  size_t head_end;
  size_t i;
  stringstream os;
  ostream aoStack_1a0 [376];
  size_t local_28;
  size_t N_local;
  size_t n_local;
  array<char,_4UL> *vals_local;
  
  local_28 = n;
  N_local = (size_t)vals;
  n_local = (size_t)this;
  vals_local = (array<char,_4UL> *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream((stringstream *)&i);
  if ((local_28 == 0) || (N_local <= local_28 << 1)) {
    ::std::operator<<(aoStack_1a0,"[");
    for (head_end = 0; head_end < N_local; head_end = head_end + 1) {
      if (head_end != 0) {
        ::std::operator<<(aoStack_1a0,", ");
      }
      ::std::operator<<(aoStack_1a0,(char4 *)(n_local + head_end * 4));
    }
    ::std::operator<<(aoStack_1a0,"]");
  }
  else {
    puVar1 = ::std::min<unsigned_long>(&local_28,&N_local);
    tail_start = *puVar1;
    i_1 = N_local - local_28;
    puVar1 = std::max<unsigned_long>(&i_1,&tail_start);
    local_1c8 = *puVar1;
    ::std::operator<<(aoStack_1a0,"[");
    for (i_2 = 0; i_2 < tail_start; i_2 = i_2 + 1) {
      if (i_2 != 0) {
        ::std::operator<<(aoStack_1a0,", ");
      }
      ::std::operator<<(aoStack_1a0,(char4 *)(n_local + i_2 * 4));
    }
    ::std::operator<<(aoStack_1a0,", ..., ");
    for (local_1e0 = local_1c8; local_1e0 < N_local; local_1e0 = local_1e0 + 1) {
      if (local_1c8 < local_1e0) {
        ::std::operator<<(aoStack_1a0,", ");
      }
      ::std::operator<<(aoStack_1a0,(char4 *)(n_local + local_1e0 * 4));
    }
    ::std::operator<<(aoStack_1a0,"]");
  }
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&i);
  return __return_storage_ptr__;
}

Assistant:

std::string print_array_snipped(const T *vals, size_t n, size_t N = 16) {
  std::stringstream os;

  if ((N == 0) || ((N * 2) >= n)) {
    os << "[";
    for (size_t i = 0; i < n; i++) {
      if (i > 0) {
        os << ", ";
      }
      os << vals[i];
    }
    os << "]";
  } else {
    size_t head_end = (std::min)(N, n);
    size_t tail_start = (std::max)(n - N, head_end);

    os << "[";

    for (size_t i = 0; i < head_end; i++) {
      if (i > 0) {
        os << ", ";
      }
      os << vals[i];
    }

    os << ", ..., ";

    for (size_t i = tail_start; i < n; i++) {
      if (i > tail_start) {
        os << ", ";
      }
      os << vals[i];
    }

    os << "]";
  }
  return os.str();
}